

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

void __thiscall QMainWindowLayoutState::saveState(QMainWindowLayoutState *this,QDataStream *stream)

{
  bool bVar1;
  const_iterator o;
  QDockWidgetGroupWindow **ppQVar2;
  QRect *pQVar3;
  QDataStream *in_RSI;
  QDockAreaLayout *in_RDI;
  long in_FS_OFFSET;
  QDataStream *unaff_retaddr;
  QToolBarAreaLayout *in_stack_00000008;
  QDockWidgetGroupWindow *floating;
  QList<QDockWidgetGroupWindow_*> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QDockWidgetGroupWindow_*> floatingTabs;
  QDataStream *in_stack_ffffffffffffff88;
  QObject *in_stack_ffffffffffffffa0;
  QDockWidgetGroupWindow *this_00;
  undefined8 in_stack_ffffffffffffffc8;
  QFlagsStorage<Qt::FindChildOption> options;
  const_iterator local_30 [2];
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  options.i = (Int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QDockAreaLayout::saveState(in_RDI,in_RSI);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QFlags<Qt::FindChildOption>::QFlags
            ((QFlags<Qt::FindChildOption> *)in_RDI,
             (FindChildOption)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  QObject::findChildren<QDockWidgetGroupWindow*>
            (in_stack_ffffffffffffffa0,(FindChildOptions)options.i);
  local_30[0].i = (QDockWidgetGroupWindow **)&DAT_aaaaaaaaaaaaaaaa;
  local_30[0] = QList<QDockWidgetGroupWindow_*>::begin((QList<QDockWidgetGroupWindow_*> *)in_RDI);
  o = QList<QDockWidgetGroupWindow_*>::end((QList<QDockWidgetGroupWindow_*> *)in_RDI);
  while (bVar1 = QList<QDockWidgetGroupWindow_*>::const_iterator::operator!=(local_30,o), bVar1) {
    ppQVar2 = QList<QDockWidgetGroupWindow_*>::const_iterator::operator*(local_30);
    this_00 = *ppQVar2;
    QDockWidgetGroupWindow::layoutInfo((QDockWidgetGroupWindow *)0x5f4b26);
    bVar1 = QDockAreaLayoutInfo::isEmpty((QDockAreaLayoutInfo *)0x5f4b2e);
    if (!bVar1) {
      in_stack_ffffffffffffff88 =
           QDataStream::operator<<
                     ((QDataStream *)in_RDI,(quint8)((ulong)in_stack_ffffffffffffff88 >> 0x38));
      pQVar3 = QWidget::geometry(&this_00->super_QWidget);
      ::operator<<(in_stack_ffffffffffffff88,(QRect *)pQVar3);
      QDockWidgetGroupWindow::layoutInfo((QDockWidgetGroupWindow *)0x5f4b69);
      QDockAreaLayoutInfo::saveState
                ((QDockAreaLayoutInfo *)floatingTabs.d.size,(QDataStream *)floatingTabs.d.ptr);
    }
    QList<QDockWidgetGroupWindow_*>::const_iterator::operator++(local_30);
  }
  QToolBarAreaLayout::saveState(in_stack_00000008,unaff_retaddr);
  QList<QDockWidgetGroupWindow_*>::~QList((QList<QDockWidgetGroupWindow_*> *)0x5f4ba2);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMainWindowLayoutState::saveState(QDataStream &stream) const
{
#if QT_CONFIG(dockwidget)
    dockAreaLayout.saveState(stream);
#if QT_CONFIG(tabbar)
    const QList<QDockWidgetGroupWindow *> floatingTabs =
        mainWindow->findChildren<QDockWidgetGroupWindow *>(Qt::FindDirectChildrenOnly);

    for (QDockWidgetGroupWindow *floating : floatingTabs) {
        if (floating->layoutInfo()->isEmpty())
            continue;
        stream << uchar(QDockAreaLayout::FloatingDockWidgetTabMarker) << floating->geometry();
        floating->layoutInfo()->saveState(stream);
    }
#endif
#endif
#if QT_CONFIG(toolbar)
    toolBarAreaLayout.saveState(stream);
#endif
}